

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect_bounder.cc
# Opt level: O2

void __thiscall
S2LatLngRectBounder::AddInternal(S2LatLngRectBounder *this,S2Point *b,S2LatLng *b_latlng)

{
  S2LatLngRect *this_00;
  VType *pVVar1;
  R1Interval *pRVar2;
  double dVar3;
  FloatType FVar4;
  double dVar5;
  VType VVar6;
  bool bVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  S1Interval SVar12;
  R1Interval lat_ab;
  double local_118;
  double dStack_110;
  double local_108;
  double local_f8;
  R1Interval *local_f0;
  S1Interval local_e8;
  double local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  double local_b8;
  VType local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [12];
  undefined4 uStack_8c;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  S2LatLngRect local_70;
  double local_48;
  double local_40;
  double dStack_38;
  
  S2LatLng::ToPoint((S2Point *)local_98,b_latlng);
  bVar7 = S2::ApproxEquals(b,(S2Point *)local_98,(S1Angle)0x3cd203af9ee75616);
  if (!bVar7) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect_bounder.cc"
               ,0x2e,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)local_70.lat_.bounds_.c_[0],
                    "Check failed: S2::ApproxEquals(b, b_latlng.ToPoint()) ");
    abort();
  }
  this_00 = &this->bound_;
  dVar3 = (this->bound_).lat_.bounds_.c_[0];
  pVVar1 = (this->bound_).lat_.bounds_.c_ + 1;
  if (dVar3 < *pVVar1 || dVar3 == *pVVar1) {
    pRVar2 = &(this->bound_).lat_;
    dVar3 = (this->a_).c_[0];
    dVar11 = (this->a_).c_[1];
    dVar5 = (this->a_).c_[2];
    dVar9 = dVar11 - b->c_[1];
    dVar10 = dVar5 - b->c_[2];
    dVar11 = dVar11 + b->c_[1];
    dVar8 = dVar3 - b->c_[0];
    dVar5 = b->c_[2] + dVar5;
    dVar3 = b->c_[0] + dVar3;
    local_118 = dVar9 * dVar5 - dVar10 * dVar11;
    dStack_110 = dVar10 * dVar3 - dVar8 * dVar5;
    local_108 = dVar8 * dVar11 - dVar3 * dVar9;
    FVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                      ((BasicVector<Vector3,_double,_3UL> *)&local_118);
    if (1.91346e-15 <= FVar4) {
      SVar12 = S1Interval::FromPointPair((this->a_latlng_).coords_.c_[1],(b_latlng->coords_).c_[1]);
      local_e8.bounds_.c_[0] = SVar12.bounds_.c_[0];
      local_e8.bounds_.c_[1] = SVar12.bounds_.c_[1];
      dVar3 = S1Interval::GetLength(&local_e8);
      if (3.1415926535897927 <= dVar3) {
        SVar12 = S1Interval::Full();
        local_e8.bounds_.c_[0] = SVar12.bounds_.c_[0];
        local_e8.bounds_.c_[1] = SVar12.bounds_.c_[1];
      }
      dVar3 = (this->a_latlng_).coords_.c_[0];
      lat_ab.bounds_.c_[0] = (b_latlng->coords_).c_[0];
      lat_ab.bounds_.c_[1] =
           (VType)(~-(ulong)(lat_ab.bounds_.c_[0] < dVar3) & (ulong)lat_ab.bounds_.c_[0] |
                  -(ulong)(lat_ab.bounds_.c_[0] < dVar3) & (ulong)dVar3);
      if (dVar3 <= lat_ab.bounds_.c_[0]) {
        lat_ab.bounds_.c_[0] = dVar3;
      }
      uStack_d0 = 0;
      uStack_a0 = 0;
      local_48 = dStack_110 - local_108 * 0.0;
      local_40 = local_108 * 0.0 - local_118;
      dStack_38 = local_118 * 0.0 - dStack_110 * 0.0;
      local_f0 = pRVar2;
      local_d8 = lat_ab.bounds_.c_[0];
      local_a8 = lat_ab.bounds_.c_[1];
      dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)&local_48,&this->a_);
      local_c8._8_4_ = extraout_XMM0_Dc;
      local_c8._0_8_ = dVar3;
      local_c8._12_4_ = extraout_XMM0_Dd;
      dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)&local_48,b);
      dVar8 = FVar4 * 6.06638e-16 + 6.83174e-31;
      if (((ABS(dVar3) <= dVar8) || (ABS((double)local_c8._0_8_) <= dVar8)) ||
         ((double)local_c8._0_8_ * dVar3 < 0.0)) {
        local_b8 = dVar3;
        dVar3 = atan2(SQRT(dStack_110 * dStack_110 + local_118 * local_118),ABS(local_108));
        dVar5 = 1.5707963267948966;
        if (dVar3 + 6.661338147750939e-16 <= 1.5707963267948966) {
          dVar5 = dVar3 + 6.661338147750939e-16;
        }
        uStack_88 = (this->a_).c_[2] - b->c_[2];
        dVar3 = (this->a_).c_[1] - b->c_[1];
        local_98._8_4_ = SUB84(dVar3,0);
        local_98._0_8_ = (this->a_).c_[0] - b->c_[0];
        uStack_8c = (int)((ulong)dVar3 >> 0x20);
        FVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                          ((BasicVector<Vector3,_double,_3UL> *)local_98);
        local_f8 = FVar4 * 0.5;
        dVar3 = sin(dVar5);
        dVar3 = asin(dVar3 * local_f8);
        dVar3 = ((dVar3 + dVar3) - (local_a8 - local_d8)) * 0.5 + 2.220446049250313e-16;
        if ((((double)local_c8._0_8_ <= dVar8) && (-dVar8 <= local_b8)) &&
           (lat_ab.bounds_.c_[1] = local_a8 + dVar3, dVar5 <= lat_ab.bounds_.c_[1])) {
          lat_ab.bounds_.c_[1] = dVar5;
        }
        if ((-dVar8 <= (double)local_c8._0_8_) && (local_b8 <= dVar8)) {
          lat_ab.bounds_.c_[0] = local_d8 - dVar3;
          if (lat_ab.bounds_.c_[0] <= -dVar5) {
            lat_ab.bounds_.c_[0] = -dVar5;
          }
        }
      }
      S2LatLngRect::S2LatLngRect(&local_70,&lat_ab,&local_e8);
      S2LatLngRect::Union((S2LatLngRect *)local_98,this_00,&local_70);
      (((S1Interval *)(local_f0 + 1))->bounds_).c_[0] = (VType)CONCAT44(uStack_7c,local_80);
      (((S1Interval *)(local_f0 + 1))->bounds_).c_[1] = (VType)CONCAT44(uStack_74,uStack_78);
      (local_f0->bounds_).c_[0] = stack0xffffffffffffff70;
      (local_f0->bounds_).c_[1] = uStack_88;
    }
    else {
      dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)this,b);
      if (0.0 <= dVar3) {
        S2LatLngRect::FromPointPair(&local_70,&this->a_latlng_,b_latlng);
        S2LatLngRect::Union((S2LatLngRect *)local_98,this_00,&local_70);
      }
      else {
        S2LatLngRect::Full();
      }
      *(undefined4 *)(this->bound_).lng_.bounds_.c_ = local_80;
      *(undefined4 *)((long)(this->bound_).lng_.bounds_.c_ + 4) = uStack_7c;
      *(undefined4 *)((this->bound_).lng_.bounds_.c_ + 1) = uStack_78;
      *(undefined4 *)((long)(this->bound_).lng_.bounds_.c_ + 0xc) = uStack_74;
      *(undefined4 *)(pRVar2->bounds_).c_ = local_98._8_4_;
      *(undefined4 *)((long)(this->bound_).lat_.bounds_.c_ + 4) = uStack_8c;
      *(undefined4 *)((this->bound_).lat_.bounds_.c_ + 1) = (undefined4)uStack_88;
      *(undefined4 *)((long)(this->bound_).lat_.bounds_.c_ + 0xc) = uStack_88._4_4_;
    }
  }
  else {
    S2LatLngRect::AddPoint(this_00,b_latlng);
  }
  (this->a_).c_[2] = b->c_[2];
  VVar6 = b->c_[1];
  (this->a_).c_[0] = b->c_[0];
  (this->a_).c_[1] = VVar6;
  VVar6 = (b_latlng->coords_).c_[1];
  (this->a_latlng_).coords_.c_[0] = (b_latlng->coords_).c_[0];
  (this->a_latlng_).coords_.c_[1] = VVar6;
  return;
}

Assistant:

void S2LatLngRectBounder::AddInternal(const S2Point& b,
                                      const S2LatLng& b_latlng) {
  // Simple consistency check to verify that b and b_latlng are alternate
  // representations of the same vertex.
  S2_DCHECK(S2::ApproxEquals(b, b_latlng.ToPoint()));

  if (bound_.is_empty()) {
    bound_.AddPoint(b_latlng);
  } else {
    // First compute the cross product N = A x B robustly.  This is the normal
    // to the great circle through A and B.  We don't use S2::RobustCrossProd()
    // since that method returns an arbitrary vector orthogonal to A if the two
    // vectors are proportional, and we want the zero vector in that case.
    Vector3_d n = (a_ - b).CrossProd(a_ + b);  // N = 2 * (A x B)

    // The relative error in N gets large as its norm gets very small (i.e.,
    // when the two points are nearly identical or antipodal).  We handle this
    // by choosing a maximum allowable error, and if the error is greater than
    // this we fall back to a different technique.  Since it turns out that
    // the other sources of error in converting the normal to a maximum
    // latitude add up to at most 1.16 * DBL_EPSILON (see below), and it is
    // desirable to have the total error be a multiple of DBL_EPSILON, we have
    // chosen to limit the maximum error in the normal to 3.84 * DBL_EPSILON.
    // It is possible to show that the error is less than this when
    //
    //   n.Norm() >= 8 * sqrt(3) / (3.84 - 0.5 - sqrt(3)) * DBL_EPSILON
    //            = 1.91346e-15 (about 8.618 * DBL_EPSILON)
    double n_norm = n.Norm();
    if (n_norm < 1.91346e-15) {
      // A and B are either nearly identical or nearly antipodal (to within
      // 4.309 * DBL_EPSILON, or about 6 nanometers on the earth's surface).
      if (a_.DotProd(b) < 0) {
        // The two points are nearly antipodal.  The easiest solution is to
        // assume that the edge between A and B could go in any direction
        // around the sphere.
        bound_ = S2LatLngRect::Full();
      } else {
        // The two points are nearly identical (to within 4.309 * DBL_EPSILON).
        // In this case we can just use the bounding rectangle of the points,
        // since after the expansion done by GetBound() this rectangle is
        // guaranteed to include the (lat,lng) values of all points along AB.
        bound_ = bound_.Union(S2LatLngRect::FromPointPair(a_latlng_, b_latlng));
      }
    } else {
      // Compute the longitude range spanned by AB.
      S1Interval lng_ab = S1Interval::FromPointPair(a_latlng_.lng().radians(),
                                                    b_latlng.lng().radians());
      if (lng_ab.GetLength() >= M_PI - 2 * DBL_EPSILON) {
        // The points lie on nearly opposite lines of longitude to within the
        // maximum error of the calculation.  (Note that this test relies on
        // the fact that M_PI is slightly less than the true value of Pi, and
        // that representable values near M_PI are 2 * DBL_EPSILON apart.)
        // The easiest solution is to assume that AB could go on either side
        // of the pole.
        lng_ab = S1Interval::Full();
      }

      // Next we compute the latitude range spanned by the edge AB.  We start
      // with the range spanning the two endpoints of the edge:
      R1Interval lat_ab = R1Interval::FromPointPair(a_latlng_.lat().radians(),
                                                    b_latlng.lat().radians());

      // This is the desired range unless the edge AB crosses the plane
      // through N and the Z-axis (which is where the great circle through A
      // and B attains its minimum and maximum latitudes).  To test whether AB
      // crosses this plane, we compute a vector M perpendicular to this
      // plane and then project A and B onto it.
      Vector3_d m = n.CrossProd(S2Point(0, 0, 1));
      double m_a = m.DotProd(a_);
      double m_b = m.DotProd(b);

      // We want to test the signs of "m_a" and "m_b", so we need to bound
      // the error in these calculations.  It is possible to show that the
      // total error is bounded by
      //
      //  (1 + sqrt(3)) * DBL_EPSILON * n_norm + 8 * sqrt(3) * (DBL_EPSILON**2)
      //    = 6.06638e-16 * n_norm + 6.83174e-31

      double m_error = 6.06638e-16 * n_norm + 6.83174e-31;
      if (m_a * m_b < 0 || fabs(m_a) <= m_error || fabs(m_b) <= m_error) {
        // Minimum/maximum latitude *may* occur in the edge interior.
        //
        // The maximum latitude is 90 degrees minus the latitude of N.  We
        // compute this directly using atan2 in order to get maximum accuracy
        // near the poles.
        //
        // Our goal is compute a bound that contains the computed latitudes of
        // all S2Points P that pass the point-in-polygon containment test.
        // There are three sources of error we need to consider:
        //  - the directional error in N (at most 3.84 * DBL_EPSILON)
        //  - converting N to a maximum latitude
        //  - computing the latitude of the test point P
        // The latter two sources of error are at most 0.955 * DBL_EPSILON
        // individually, but it is possible to show by a more complex analysis
        // that together they can add up to at most 1.16 * DBL_EPSILON, for a
        // total error of 5 * DBL_EPSILON.
        //
        // We add 3 * DBL_EPSILON to the bound here, and GetBound() will pad
        // the bound by another 2 * DBL_EPSILON.
        double max_lat = min(
            atan2(sqrt(n[0]*n[0] + n[1]*n[1]), fabs(n[2])) + 3 * DBL_EPSILON,
            M_PI_2);

        // In order to get tight bounds when the two points are close together,
        // we also bound the min/max latitude relative to the latitudes of the
        // endpoints A and B.  First we compute the distance between A and B,
        // and then we compute the maximum change in latitude between any two
        // points along the great circle that are separated by this distance.
        // This gives us a latitude change "budget".  Some of this budget must
        // be spent getting from A to B; the remainder bounds the round-trip
        // distance (in latitude) from A or B to the min or max latitude
        // attained along the edge AB.
        double lat_budget = 2 * asin(0.5 * (a_ - b).Norm() * sin(max_lat));
        double max_delta = 0.5*(lat_budget - lat_ab.GetLength()) + DBL_EPSILON;

        // Test whether AB passes through the point of maximum latitude or
        // minimum latitude.  If the dot product(s) are small enough then the
        // result may be ambiguous.
        if (m_a <= m_error && m_b >= -m_error) {
          lat_ab.set_hi(min(max_lat, lat_ab.hi() + max_delta));
        }
        if (m_b <= m_error && m_a >= -m_error) {
          lat_ab.set_lo(max(-max_lat, lat_ab.lo() - max_delta));
        }
      }
      bound_ = bound_.Union(S2LatLngRect(lat_ab, lng_ab));
    }
  }
  a_ = b;
  a_latlng_ = b_latlng;
}